

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.hpp
# Opt level: O0

void __thiscall
asio::detail::scoped_ptr<asio::io_context>::~scoped_ptr(scoped_ptr<asio::io_context> *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  
  pvVar1 = (void *)*in_RDI;
  if (pvVar1 != (void *)0x0) {
    asio::io_context::~io_context((io_context *)0x1c53d6);
    operator_delete(pvVar1);
  }
  return;
}

Assistant:

~scoped_ptr()
  {
    delete p_;
  }